

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall MlmWrap::getClients_abi_cxx11_(MlmWrap *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *cl;
  lock_guard<std::mutex> lock;
  zmsg_t *msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *clients;
  value_type *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  allocator *paVar2;
  allocator local_59;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  undefined1 local_2d;
  zmsg_t *local_18 [3];
  
  local_18[0] = czhelp_zmsg_create("s","CLI",0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)in_stack_ffffffffffffff58);
  zactor_send(*(zactor_t **)(in_RSI + 0x40),local_18);
  local_18[0] = zactor_recv(*(zactor_t **)(in_RSI + 0x40));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f5610);
  local_2d = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f561f);
  local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)zmsg_popstr(local_18[0]);
  while (pvVar1 = local_38,
        local_38 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
    paVar2 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)pvVar1,paVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    free(local_38);
    local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    in_stack_ffffffffffffff60 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)zmsg_popstr(local_18[0]);
    local_38 = in_stack_ffffffffffffff60;
  }
  zmsg_destroy(local_18);
  return in_RDI;
}

Assistant:

std::vector<std::string> MlmWrap::getClients(){
    zmsg_t *msg = czhelp_zmsg_create("s", getclients, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    std::vector<std::string> clients;
    char *cl = zmsg_popstr(msg);
    while(cl){
        clients.push_back(cl);
        freen(cl);
        cl = zmsg_popstr(msg);
    }
    zmsg_destroy(&msg);
    return clients;
}